

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi.cpp
# Opt level: O3

int anon_unknown.dwarf_747f::RtMidi_seterrorcallback(lua_State *L)

{
  int iVar1;
  mapped_type mVar2;
  RtMidi *pRVar3;
  mapped_type *pmVar4;
  iterator iVar5;
  key_type local_38;
  
  lua_getfield(L,0xfff0b9d8,"luartmidi.rtmidi");
  pRVar3 = luaGetUserdata<RtMidi>(L,1,"RtMidi");
  iVar1 = lua_type(L,2);
  local_38.first = pRVar3;
  local_38.second = L;
  if (iVar1 < 1) {
    (*pRVar3->_vptr_RtMidi[6])(pRVar3,RtMidiDefaultErrorCallback,L);
    pmVar4 = std::
             map<std::pair<RtMidi_*,_lua_State_*>,_int,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
             ::operator[]((map<std::pair<RtMidi_*,_lua_State_*>,_int,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
                           *)(anonymous_namespace)::RtMidi_callbacks,&local_38);
    *pmVar4 = -2;
  }
  else {
    lua_pushvalue(L,2);
    lua_pushvalue(L,3);
    lua_pushcclosure(L,RtMidi_callbackwrapper,2);
    mVar2 = luaL_ref(L,0xfff0b9d8);
    pmVar4 = std::
             map<std::pair<RtMidi_*,_lua_State_*>,_int,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
             ::operator[]((map<std::pair<RtMidi_*,_lua_State_*>,_int,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
                           *)(anonymous_namespace)::RtMidi_callbacks,&local_38);
    *pmVar4 = mVar2;
    local_38.first = pRVar3;
    local_38.second = L;
    iVar5 = std::
            _Rb_tree<std::pair<RtMidi_*,_lua_State_*>,_std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>,_std::_Select1st<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
            ::find((_Rb_tree<std::pair<RtMidi_*,_lua_State_*>,_std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>,_std::_Select1st<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
                    *)(anonymous_namespace)::RtMidi_callbacks,&local_38);
    (*pRVar3->_vptr_RtMidi[6])(pRVar3,RtMidiCustomErrorCallback,iVar5._M_node + 1);
  }
  return 0;
}

Assistant:

int RtMidi_seterrorcallback(lua_State *L) {
	auto &self = getRtMidi(L, 1);
	if (lua_isnoneornil(L, 2))
		RtMidi_init(self, L, 1);
	else {
		lua_pushvalue(L, 2);
		lua_pushvalue(L, 3);
		lua_pushcclosure(L, RtMidi_callbackwrapper, 2);
		RtMidi_callbacks[{&self, L}] = luaL_ref(L, LUA_REGISTRYINDEX);
		auto it = RtMidi_callbacks.find({&self, L});
		self.setErrorCallback(RtMidiCustomErrorCallback,
		 static_cast<void *>(const_cast<RtMidi_callback_rec *>(&it->first)));

//		lua_pushlightuserdata(L, &REGISTRY_CALLBACK_ENABLED);
//		lua_rawget(L, LUA_REGISTRYINDEX);
//		lua_pushvalue(L, 1);
//		lua_pushboolean(L, true);
//		lua_rawset(L, -3);
//		lua_pop(L, 1);
	}
	return 0;
}